

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

void __thiscall
stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::errcode>
          (base_message<std::allocator<unsigned_char>_> *this,errcode *attr)

{
  size_t sVar1;
  size_t sVar2;
  stun_msg_hdr *msg_hdr;
  errcode *attr_local;
  base_message<std::allocator<unsigned_char>_> *this_local;
  
  sVar1 = size(this);
  sVar2 = attribute::bits::errcode::size(attr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->buffer_,sVar1 + sVar2);
  msg_hdr = (stun_msg_hdr *)
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->buffer_);
  attribute::bits::errcode::append(attr,msg_hdr);
  return;
}

Assistant:

void push_back(const AttributeType &attr) {
    buffer_.resize(size() + attr.size());
    attr.append(reinterpret_cast<stun_msg_hdr*>(buffer_.data()));
  }